

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_write.c
# Opt level: O0

int main(int argc,char **args)

{
  char *__filename;
  int iVar1;
  light_pcapng p_Var2;
  FILE *__s;
  uint32_t *__s1;
  FILE *__stream;
  void *__ptr;
  size_t sVar3;
  long in_RSI;
  int in_EDI;
  int status;
  uint8_t *data_check;
  FILE *f_check;
  stat f_info;
  uint32_t *data;
  size_t size;
  FILE *tmp;
  light_pcapng pcapng;
  char *file;
  int i;
  light_pcapng in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  size_t local_a0;
  size_t *in_stack_ffffffffffffff70;
  light_pcapng in_stack_ffffffffffffff78;
  size_t local_38;
  int local_14;
  
  for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
    __filename = *(char **)(in_RSI + (long)local_14 * 8);
    p_Var2 = light_read_from_path(in_stack_ffffffffffffff38);
    if (p_Var2 == (light_pcapng)0x0) {
      fprintf(_stderr,"Unable to read pcapng: %s\n",__filename);
    }
    else {
      __s = fopen("/tmp/pcapng.tmp","wb");
      __s1 = light_pcapng_to_memory(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      __stream = fopen(__filename,"rb");
      stat(__filename,(stat *)&stack0xffffffffffffff30);
      if (local_38 == local_a0) {
        printf("Data for %s: %zu bytes\n",__filename,local_38);
        __ptr = calloc(local_38,1);
        sVar3 = fread(__ptr,1,local_38,__stream);
        if (sVar3 == local_38) {
          iVar1 = memcmp(__s1,__ptr,local_38);
          if (iVar1 == 0) {
            printf("SUCCESS for %s\n\n",__filename);
          }
          else {
            fprintf(_stderr,"FAILURE for %s\n\n",__filename);
          }
          fwrite(__s1,local_38,1,__s);
          free(__ptr);
        }
        else {
          fprintf(_stderr,"Error reading %s!\n",__filename);
          free(__ptr);
        }
      }
      else {
        fprintf(_stderr,"Memory size mismatch %zu != %zu\n",local_38,local_a0);
      }
      fclose(__stream);
      fclose(__s);
      free(__s1);
      light_pcapng_release(in_stack_ffffffffffffff30);
    }
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			FILE *tmp = fopen(TMP_FILE, "wb");
			size_t size;
			uint32_t *data = light_pcapng_to_memory(pcapng, &size);
			struct stat f_info;
			FILE *f_check = fopen(file, "rb");
			uint8_t *data_check;
			int status = 0;

			stat(file, &f_info);
			if (size != f_info.st_size) {
				fprintf(stderr, "Memory size mismatch %zu != %zu\n", size, f_info.st_size);
				goto EARLY_FAILURE;
			}
			printf("Data for %s: %zu bytes\n", file, size);

			data_check = calloc(size, 1);
			if (fread(data_check, 1, size, f_check) != size) {
				fprintf(stderr, "Error reading %s!\n", file);
				free(data_check);
				goto EARLY_FAILURE;
			}

			status = memcmp(data, data_check, size);

			if (status == 0) {
				printf("SUCCESS for %s\n\n", file);
			}
			else {
				fprintf(stderr, "FAILURE for %s\n\n", file);
			}

			fwrite(data, size, 1, tmp);

			free(data_check);
EARLY_FAILURE:
			fclose(f_check);
			fclose(tmp);
			free(data);
			light_pcapng_release(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	// unlink(TMP_FILE);

	return EXIT_SUCCESS;
}